

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O2

double * __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::operator()
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,size_t row,size_t col)

{
  bool bVar1;
  size_t index_00;
  double *pdVar2;
  size_t index;
  size_t local_20;
  
  local_20 = 0;
  bVar1 = valueIndexForOuterAndInnerIndices(this,row,col,&local_20);
  index_00 = local_20;
  if (!bVar1) {
    index_00 = insert(this,row,col,0.0);
  }
  pdVar2 = VectorDynSize::operator()(&this->m_values,index_00);
  return pdVar2;
}

Assistant:

double& SparseMatrix<iDynTree::RowMajor>::operator()(std::size_t row, std::size_t col)
    {
        assert(row >= 0 && row < rows()
               && col >= 0 && col < columns());

        std::size_t index = 0;
        if (valueIndexForOuterAndInnerIndices(row, col, index)) {
            return m_values(index);
        } else {
            return m_values(insert(row, col, 0));
        }
    }